

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int __thiscall
re2::RepetitionWalker::PostVisit
          (RepetitionWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  int local_34;
  int local_30;
  int i;
  int arg;
  int nchild_args_local;
  int *child_args_local;
  int pre_arg_local;
  int parent_arg_local;
  Regexp *re_local;
  RepetitionWalker *this_local;
  
  local_30 = pre_arg;
  for (local_34 = 0; local_34 < nchild_args; local_34 = local_34 + 1) {
    if (child_args[local_34] < local_30) {
      local_30 = child_args[local_34];
    }
  }
  return local_30;
}

Assistant:

int RepetitionWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                                int* child_args, int nchild_args) {
  int arg = pre_arg;
  for (int i = 0; i < nchild_args; i++) {
    if (child_args[i] < arg) {
      arg = child_args[i];
    }
  }
  return arg;
}